

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O2

int fits_read_wcstab(fitsfile *fptr,int nwtb,wtbarr *wtb,int *status)

{
  size_t sVar1;
  int iVar2;
  double ***pppdVar3;
  size_t *naxes;
  double *pdVar4;
  int iVar5;
  long lVar6;
  size_t __nmemb;
  wtbarr *pwVar7;
  int iVar8;
  bool bVar9;
  int naxis;
  int colnum;
  fitsfile *local_48;
  int local_40;
  int hdunum;
  int nostat;
  int anynul;
  
  iVar5 = *status;
  if (iVar5 == 0) {
    if (fptr == (fitsfile *)0x0) {
      *status = 0x73;
      iVar5 = 0x73;
    }
    else if (nwtb == 0) {
      iVar5 = 0;
    }
    else {
      iVar8 = 0;
      if (0 < nwtb) {
        iVar8 = nwtb;
      }
      pppdVar3 = &wtb->arrayp;
      iVar5 = iVar8;
      while (bVar9 = iVar5 != 0, iVar5 = iVar5 + -1, bVar9) {
        **pppdVar3 = (double *)0x0;
        pppdVar3 = pppdVar3 + 0x19;
      }
      ffghdn(fptr,&hdunum);
      iVar5 = 0;
      pwVar7 = wtb;
      local_48 = fptr;
      while (((iVar5 != iVar8 &&
              (iVar2 = ffmnhd(fptr,2,pwVar7->extnam,pwVar7->extver,status), iVar2 == 0)) &&
             (iVar2 = ffgcno(fptr,0,pwVar7->ttype,&colnum,status), iVar2 == 0))) {
        iVar2 = pwVar7->ndim;
        local_40 = iVar5;
        if ((long)iVar2 < 1) {
          iVar5 = 0x143;
          naxes = (size_t *)0x0;
LAB_001f2783:
          *status = iVar5;
          goto LAB_001f2786;
        }
        naxes = (size_t *)calloc((long)iVar2,8);
        if (naxes == (size_t *)0x0) {
LAB_001f2766:
          naxes = (size_t *)0x0;
          iVar5 = 0x71;
          goto LAB_001f2783;
        }
        iVar5 = ffgtdm(local_48,colnum,iVar2,&naxis,(long *)naxes,status);
        if (iVar5 != 0) goto LAB_001f2786;
        if (naxis == pwVar7->ndim) {
          if (pwVar7->kind == 99) goto LAB_001f271a;
          __nmemb = *naxes;
          if (__nmemb != (long)*pwVar7->dimlen) {
            iVar5 = 0x107;
            goto LAB_001f2783;
          }
        }
        else {
          if ((pwVar7->ndim != 2) || (pwVar7->kind != 99)) {
            iVar5 = 0x107;
            goto LAB_001f2783;
          }
          naxis = 2;
          naxes[1] = *naxes;
          *naxes = 1;
LAB_001f271a:
          __nmemb = *naxes;
          for (lVar6 = 0; lVar6 < naxis + -1; lVar6 = lVar6 + 1) {
            sVar1 = naxes[lVar6 + 1];
            pwVar7->dimlen[lVar6] = (int)sVar1;
            __nmemb = __nmemb * sVar1;
          }
        }
        free(naxes);
        pdVar4 = (double *)calloc(__nmemb,8);
        fptr = local_48;
        *pwVar7->arrayp = pdVar4;
        if (pdVar4 == (double *)0x0) goto LAB_001f2766;
        iVar5 = ffgcvd(local_48,colnum,pwVar7->row,1,__nmemb,0.0,*pwVar7->arrayp,&anynul,status);
        if (iVar5 != 0) break;
        iVar5 = local_40 + 1;
        pwVar7 = pwVar7 + 1;
      }
      naxes = (size_t *)0x0;
LAB_001f2786:
      nostat = 0;
      iVar5 = 0;
      ffmahd(local_48,hdunum,(int *)0x0,&nostat);
      free(naxes);
      if (*status != 0) {
        pppdVar3 = &wtb->arrayp;
        while (bVar9 = iVar8 != 0, iVar8 = iVar8 + -1, bVar9) {
          free(**pppdVar3);
          pppdVar3 = pppdVar3 + 0x19;
        }
        iVar5 = *status;
      }
    }
  }
  return iVar5;
}

Assistant:

int fits_read_wcstab(
   fitsfile   *fptr, /* I - FITS file pointer           */
   int  nwtb,        /* Number of arrays to be read from the binary table(s) */
   wtbarr *wtb,      /* Address of the first element of an array of wtbarr
                         typedefs.  This wtbarr typedef is defined below to
                         match the wtbarr struct defined in WCSLIB.  An array
                         of such structs returned by the WCSLIB function
                         wcstab(). */
   int  *status)

/*
*   Author: Mark Calabretta, Australia Telescope National Facility
*   http://www.atnf.csiro.au/~mcalabre/index.html
*
*   fits_read_wcstab() extracts arrays from a binary table required in
*   constructing -TAB coordinates.  This helper routine is intended for
*   use by routines in the WCSLIB library when dealing with the -TAB table
*   look up WCS convention.
*/

{
   int  anynul, colnum, hdunum, iwtb, m, naxis, nostat;
   long *naxes = 0, nelem;
   wtbarr *wtbp;


   if (*status) return *status;

   if (fptr == 0) {
      return (*status = NULL_INPUT_PTR);
   }

   if (nwtb == 0) return 0;

   /* Zero the array pointers. */
   wtbp = wtb;
   for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
     *wtbp->arrayp = 0x0;
   }

   /* Save HDU number so that we can move back to it later. */
   fits_get_hdu_num(fptr, &hdunum);

   wtbp = wtb;
   for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
      /* Move to the required binary table extension. */
      if (fits_movnam_hdu(fptr, BINARY_TBL, (char *)(wtbp->extnam),
          wtbp->extver, status)) {
         goto cleanup;
      }

      /* Locate the table column. */
      if (fits_get_colnum(fptr, CASEINSEN, (char *)(wtbp->ttype), &colnum,
          status)) {
         goto cleanup;
      }

      /* Get the array dimensions and check for consistency. */
      if (wtbp->ndim < 1) {
         *status = NEG_AXIS;
         goto cleanup;
      }

      if (!(naxes = calloc(wtbp->ndim, sizeof(long)))) {
         *status = MEMORY_ALLOCATION;
         goto cleanup;
      }

      if (fits_read_tdim(fptr, colnum, wtbp->ndim, &naxis, naxes, status)) {
         goto cleanup;
      }

      if (naxis != wtbp->ndim) {
         if (wtbp->kind == 'c' && wtbp->ndim == 2) {
            /* Allow TDIMn to be omitted for degenerate coordinate arrays. */
            naxis = 2;
            naxes[1] = naxes[0];
            naxes[0] = 1;
         } else {
            *status = BAD_TDIM;
            goto cleanup;
         }
      }

      if (wtbp->kind == 'c') {
         /* Coordinate array; calculate the array size. */
         nelem = naxes[0];
         for (m = 0; m < naxis-1; m++) {
            *(wtbp->dimlen + m) = naxes[m+1];
            nelem *= naxes[m+1];
         }
      } else {
         /* Index vector; check length. */
         if ((nelem = naxes[0]) != *(wtbp->dimlen)) {
            /* N.B. coordinate array precedes the index vectors. */
            *status = BAD_TDIM;
            goto cleanup;
         }
      }

      free(naxes);
      naxes = 0;

      /* Allocate memory for the array. */
      if (!(*wtbp->arrayp = calloc((size_t)nelem, sizeof(double)))) {
         *status = MEMORY_ALLOCATION;
         goto cleanup;
      }

      /* Read the array from the table. */
      if (fits_read_col_dbl(fptr, colnum, wtbp->row, 1L, nelem, 0.0,
          *wtbp->arrayp, &anynul, status)) {
         goto cleanup;
      }
   }

cleanup:
   /* Move back to the starting HDU. */
   nostat = 0;
   fits_movabs_hdu(fptr, hdunum, 0, &nostat);

   /* Release allocated memory. */
   if (naxes) free(naxes);
   if (*status) {
      wtbp = wtb;
      for (iwtb = 0; iwtb < nwtb; iwtb++, wtbp++) {
         if (*wtbp->arrayp) free(*wtbp->arrayp);
      }
   }

   return *status;
}